

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_cindex(jit_State *J,TRef tr)

{
  TRef TVar1;
  uint in_ESI;
  long in_RDI;
  int unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined8 in_stack_fffffffffffffff8;
  
  if ((in_ESI & 0x1f000000) == 0xe000000) {
    *(undefined2 *)(in_RDI + 0xa4) = 0x5915;
    *(short *)(in_RDI + 0xa0) = (short)in_ESI;
    *(undefined2 *)(in_RDI + 0xa2) = 0x12ae;
    TVar1 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  else {
    TVar1 = narrow_stripov(J,tr,unaff_retaddr,(IRRef)((ulong)in_stack_fffffffffffffff8 >> 0x20));
  }
  return TVar1;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_cindex(jit_State *J, TRef tr)
{
  lj_assertJ(tref_isnumber(tr), "expected number type");
  if (tref_isnum(tr))
    return emitir(IRT(IR_CONV, IRT_INTP), tr, (IRT_INTP<<5)|IRT_NUM|IRCONV_ANY);
  /* Undefined overflow semantics allow stripping of ADDOV, SUBOV and MULOV. */
  return narrow_stripov(J, tr, IR_MULOV,
			LJ_64 ? ((IRT_INTP<<5)|IRT_INT|IRCONV_SEXT) :
				((IRT_INTP<<5)|IRT_INT|IRCONV_TOBIT));
}